

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O3

void jinit_upsampler(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  _func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *p_Var3;
  bool bVar4;
  int iVar5;
  jpeg_upsampler *pjVar6;
  long lVar7;
  int iVar8;
  code *pcVar9;
  int iVar10;
  jpeg_upsampler *pjVar11;
  long lVar12;
  boolean *pbVar13;
  
  if (cinfo->master->jinit_upsampler_no_alloc == 0) {
    pjVar6 = (jpeg_upsampler *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
    cinfo->upsample = pjVar6;
    pjVar6->start_pass = start_pass_upsample;
    pjVar6->upsample = sep_upsample;
    pjVar6->need_context_rows = 0;
  }
  else {
    pjVar6 = cinfo->upsample;
  }
  if (cinfo->CCIR601_sampling != 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x19;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->do_fancy_upsampling == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = 1 < cinfo->min_DCT_scaled_size;
  }
  if (0 < cinfo->num_components) {
    pbVar13 = &cinfo->comp_info->component_needed;
    lVar12 = 0;
    do {
      iVar10 = (pbVar13[-10] * pbVar13[-3]) / cinfo->min_DCT_scaled_size;
      iVar8 = (pbVar13[-3] * pbVar13[-9]) / cinfo->min_DCT_scaled_size;
      iVar5 = cinfo->max_h_samp_factor;
      iVar1 = cinfo->max_v_samp_factor;
      *(int *)((long)&pjVar6[8].start_pass + lVar12 * 4) = iVar8;
      pcVar9 = noop_upsample;
      pjVar11 = (jpeg_upsampler *)&pjVar6[4].upsample;
      if ((*pbVar13 == 0) || ((iVar10 == iVar5 && (pcVar9 = fullsize_upsample, iVar8 == iVar1)))) {
LAB_001296af:
        (&pjVar11->start_pass)[lVar12] = pcVar9;
      }
      else {
        if ((iVar10 * 2 == iVar5) && (iVar8 == iVar1)) {
          if ((bVar4) && (2 < (uint)pbVar13[-2])) {
            iVar5 = jsimd_can_h2v1_fancy_upsample();
            if (iVar5 == 0) {
              pcVar9 = h2v1_fancy_upsample;
            }
            else {
              pcVar9 = jsimd_h2v1_fancy_upsample;
            }
          }
          else {
            iVar5 = jsimd_can_h2v1_upsample();
            if (iVar5 == 0) {
              pcVar9 = h2v1_upsample;
            }
            else {
              pcVar9 = jsimd_h2v1_upsample;
            }
          }
LAB_0012964a:
          (&pjVar6[4].upsample)[lVar12] = pcVar9;
        }
        else if ((bool)((iVar8 * 2 == iVar1 && iVar10 == iVar5) & bVar4)) {
          (&pjVar6[4].upsample)[lVar12] = h1v2_fancy_upsample;
          pjVar6->need_context_rows = 1;
        }
        else if ((iVar10 * 2 == iVar5) && (iVar8 * 2 == iVar1)) {
          if ((!bVar4) || ((uint)pbVar13[-2] < 3)) {
            iVar5 = jsimd_can_h2v2_upsample();
            if (iVar5 == 0) {
              pcVar9 = h2v2_upsample;
            }
            else {
              pcVar9 = jsimd_h2v2_upsample;
            }
            goto LAB_0012964a;
          }
          iVar5 = jsimd_can_h2v2_fancy_upsample();
          pcVar9 = h2v2_fancy_upsample;
          if (iVar5 != 0) {
            pcVar9 = jsimd_h2v2_fancy_upsample;
          }
          (&pjVar6[4].upsample)[lVar12] = pcVar9;
          pjVar6->need_context_rows = 1;
        }
        else {
          if (iVar5 % iVar10 == 0) {
            if (iVar1 % iVar8 == 0) {
              (&pjVar6[4].upsample)[lVar12] = int_upsample;
              *(char *)((long)&pjVar6[9].need_context_rows + lVar12) = (char)(iVar5 / iVar10);
              *(char *)((long)&pjVar6[10].start_pass + lVar12 + 2) = (char)(iVar1 / iVar8);
              goto LAB_00129656;
            }
          }
          pjVar2 = cinfo->err;
          pjVar2->msg_code = 0x26;
          (*pjVar2->error_exit)((j_common_ptr)cinfo);
        }
LAB_00129656:
        if (cinfo->master->jinit_upsampler_no_alloc == 0) {
          p_Var3 = cinfo->mem->alloc_sarray;
          lVar7 = jround_up((ulong)cinfo->output_width,(long)cinfo->max_h_samp_factor);
          pcVar9 = (code *)(*p_Var3)((j_common_ptr)cinfo,1,(JDIMENSION)lVar7,
                                     cinfo->max_v_samp_factor);
          pjVar11 = pjVar6 + 1;
          goto LAB_001296af;
        }
      }
      lVar12 = lVar12 + 1;
      pbVar13 = pbVar13 + 0x18;
    } while (lVar12 < cinfo->num_components);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_upsampler(j_decompress_ptr cinfo)
{
  my_upsample_ptr upsample;
  int ci;
  jpeg_component_info *compptr;
  boolean need_buffer, do_fancy;
  int h_in_group, v_in_group, h_out_group, v_out_group;

  if (!cinfo->master->jinit_upsampler_no_alloc) {
    upsample = (my_upsample_ptr)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(my_upsampler));
    cinfo->upsample = (struct jpeg_upsampler *)upsample;
    upsample->pub.start_pass = start_pass_upsample;
    upsample->pub.upsample = sep_upsample;
    upsample->pub.need_context_rows = FALSE; /* until we find out differently */
  } else
    upsample = (my_upsample_ptr)cinfo->upsample;

  if (cinfo->CCIR601_sampling)  /* this isn't supported */
    ERREXIT(cinfo, JERR_CCIR601_NOTIMPL);

  /* jdmainct.c doesn't support context rows when min_DCT_scaled_size = 1,
   * so don't ask for it.
   */
  do_fancy = cinfo->do_fancy_upsampling && cinfo->_min_DCT_scaled_size > 1;

  /* Verify we can handle the sampling factors, select per-component methods,
   * and create storage as needed.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Compute size of an "input group" after IDCT scaling.  This many samples
     * are to be converted to max_h_samp_factor * max_v_samp_factor pixels.
     */
    h_in_group = (compptr->h_samp_factor * compptr->_DCT_scaled_size) /
                 cinfo->_min_DCT_scaled_size;
    v_in_group = (compptr->v_samp_factor * compptr->_DCT_scaled_size) /
                 cinfo->_min_DCT_scaled_size;
    h_out_group = cinfo->max_h_samp_factor;
    v_out_group = cinfo->max_v_samp_factor;
    upsample->rowgroup_height[ci] = v_in_group; /* save for use later */
    need_buffer = TRUE;
    if (!compptr->component_needed) {
      /* Don't bother to upsample an uninteresting component. */
      upsample->methods[ci] = noop_upsample;
      need_buffer = FALSE;
    } else if (h_in_group == h_out_group && v_in_group == v_out_group) {
      /* Fullsize components can be processed without any work. */
      upsample->methods[ci] = fullsize_upsample;
      need_buffer = FALSE;
    } else if (h_in_group * 2 == h_out_group && v_in_group == v_out_group) {
      /* Special cases for 2h1v upsampling */
      if (do_fancy && compptr->downsampled_width > 2) {
        if (jsimd_can_h2v1_fancy_upsample())
          upsample->methods[ci] = jsimd_h2v1_fancy_upsample;
        else
          upsample->methods[ci] = h2v1_fancy_upsample;
      } else {
        if (jsimd_can_h2v1_upsample())
          upsample->methods[ci] = jsimd_h2v1_upsample;
        else
          upsample->methods[ci] = h2v1_upsample;
      }
    } else if (h_in_group == h_out_group &&
               v_in_group * 2 == v_out_group && do_fancy) {
      /* Non-fancy upsampling is handled by the generic method */
#if defined(__arm__) || defined(__aarch64__) || \
    defined(_M_ARM) || defined(_M_ARM64)
      if (jsimd_can_h1v2_fancy_upsample())
        upsample->methods[ci] = jsimd_h1v2_fancy_upsample;
      else
#endif
        upsample->methods[ci] = h1v2_fancy_upsample;
      upsample->pub.need_context_rows = TRUE;
    } else if (h_in_group * 2 == h_out_group &&
               v_in_group * 2 == v_out_group) {
      /* Special cases for 2h2v upsampling */
      if (do_fancy && compptr->downsampled_width > 2) {
        if (jsimd_can_h2v2_fancy_upsample())
          upsample->methods[ci] = jsimd_h2v2_fancy_upsample;
        else
          upsample->methods[ci] = h2v2_fancy_upsample;
        upsample->pub.need_context_rows = TRUE;
      } else {
        if (jsimd_can_h2v2_upsample())
          upsample->methods[ci] = jsimd_h2v2_upsample;
        else
          upsample->methods[ci] = h2v2_upsample;
      }
    } else if ((h_out_group % h_in_group) == 0 &&
               (v_out_group % v_in_group) == 0) {
      /* Generic integral-factors upsampling method */
#if defined(__mips__)
      if (jsimd_can_int_upsample())
        upsample->methods[ci] = jsimd_int_upsample;
      else
#endif
        upsample->methods[ci] = int_upsample;
      upsample->h_expand[ci] = (UINT8)(h_out_group / h_in_group);
      upsample->v_expand[ci] = (UINT8)(v_out_group / v_in_group);
    } else
      ERREXIT(cinfo, JERR_FRACT_SAMPLE_NOTIMPL);
    if (need_buffer && !cinfo->master->jinit_upsampler_no_alloc) {
      upsample->color_buf[ci] = (*cinfo->mem->alloc_sarray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE,
         (JDIMENSION)jround_up((long)cinfo->output_width,
                               (long)cinfo->max_h_samp_factor),
         (JDIMENSION)cinfo->max_v_samp_factor);
    }
  }
}